

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Detail::Approx::setMargin(Approx *this,double newMargin)

{
  ReusableStringStream *pRVar1;
  char local_5d [13];
  ReusableStringStream local_50;
  string local_38;
  double local_18;
  double newMargin_local;
  Approx *this_local;
  
  if (newMargin < 0.0) {
    local_18 = newMargin;
    newMargin_local = (double)this;
    ReusableStringStream::ReusableStringStream(&local_50);
    pRVar1 = ReusableStringStream::operator<<(&local_50,(char (*) [25])"Invalid Approx::margin: ");
    pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_18);
    local_5d[0] = '.';
    pRVar1 = ReusableStringStream::operator<<(pRVar1,local_5d);
    pRVar1 = ReusableStringStream::operator<<
                       (pRVar1,(char (*) [40])" Approx::Margin has to be non-negative.");
    ReusableStringStream::str_abi_cxx11_(&local_38,pRVar1);
    throw_domain_error(&local_38);
  }
  this->m_margin = newMargin;
  return;
}

Assistant:

void Approx::setMargin(double newMargin) {
      CATCH_ENFORCE(newMargin >= 0, "Invalid Approx::margin: " << newMargin << '.' << " Approx::Margin has to be non-negative.");
      m_margin = newMargin;
    }